

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginMainMenuBar(void)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiContext *g;
  float fVar6;
  ImVec2 local_18;
  
  pIVar3 = GImGui;
  fVar1 = (GImGui->Style).FramePadding.y;
  fVar6 = (GImGui->Style).DisplaySafeAreaPadding.y - fVar1;
  fVar6 = (float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
  (GImGui->NextWindowData).MenuBarOffsetMinVal.x = (GImGui->Style).DisplaySafeAreaPadding.x;
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.y = fVar6;
  (pIVar3->NextWindowData).PosVal.x = 0.0;
  (pIVar3->NextWindowData).PosVal.y = 0.0;
  (pIVar3->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar3->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar3->NextWindowData).PosCond = 1;
  (pIVar3->NextWindowData).SizeCond = 1;
  fVar2 = pIVar3->FontBaseSize;
  (pIVar3->NextWindowData).SizeVal.x = (pIVar3->IO).DisplaySize.x;
  (pIVar3->NextWindowData).SizeVal.y = fVar6 + fVar2 + fVar1;
  PushStyleVar(2,0.0);
  local_18.x = 0.0;
  local_18.y = 0.0;
  PushStyleVar(4,&local_18);
  bVar5 = false;
  bVar4 = Begin("##MainMenuBar",(bool *)0x0,0x50f);
  if (bVar4) {
    bVar5 = BeginMenuBar();
  }
  PopStyleVar(2);
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  if (bVar5 == false) {
    End();
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    SetNextWindowPos(ImVec2(0.0f, 0.0f));
    SetNextWindowSize(ImVec2(g.IO.DisplaySize.x, g.NextWindowData.MenuBarOffsetMinVal.y + g.FontBaseSize + g.Style.FramePadding.y));
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0,0));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true;
}